

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O1

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::downscaleImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int factor)

{
  int iVar1;
  long lVar2;
  long lVar3;
  unsigned_short ***pppuVar4;
  unsigned_short ***pppuVar5;
  unsigned_short ***pppuVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  unsigned_short *puVar10;
  ulong *puVar11;
  ushort *puVar12;
  long lVar13;
  unsigned_short *puVar14;
  int iVar15;
  ulong uVar16;
  unsigned_short *puVar17;
  long lVar18;
  int iVar19;
  long i;
  long lVar20;
  int ii;
  ulong uVar21;
  ulong *puVar22;
  ushort *puVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  
  if (factor < 2) {
    __return_storage_ptr__->depth = 0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->pixel = (unsigned_short *)0x0;
    __return_storage_ptr__->row = (unsigned_short **)0x0;
    __return_storage_ptr__->img = (unsigned_short ***)0x0;
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              (__return_storage_ptr__,image->width,image->height,(long)image->depth);
    memcpy(__return_storage_ptr__->pixel,image->pixel,__return_storage_ptr__->n * 2);
  }
  else {
    uVar25 = (ulong)(uint)factor;
    lVar2 = image->width;
    lVar3 = image->height;
    iVar1 = image->depth;
    __return_storage_ptr__->depth = 0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->pixel = (unsigned_short *)0x0;
    __return_storage_ptr__->row = (unsigned_short **)0x0;
    __return_storage_ptr__->img = (unsigned_short ***)0x0;
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              (__return_storage_ptr__,(long)(lVar2 + (uVar25 - 1)) / (long)uVar25,
               (long)((uVar25 - 1) + lVar3) / (long)uVar25,(long)iVar1);
    iVar1 = image->depth;
    if (0 < (long)iVar1) {
      uVar16 = (ulong)(uint)factor;
      pppuVar4 = __return_storage_ptr__->img;
      lVar2 = image->width;
      lVar3 = image->height;
      pppuVar5 = image->img;
      lVar13 = 0;
      do {
        puVar14 = *pppuVar4[lVar13];
        if (lVar3 < (long)uVar25) {
          uVar27 = 0;
        }
        else {
          lVar20 = image->width;
          pppuVar6 = image->img;
          uVar24 = uVar25;
          uVar21 = 0;
          do {
            uVar27 = uVar24;
            if (factor == 2) {
              if (lVar20 < 2) goto LAB_00111fb4;
              puVar17 = pppuVar6[lVar13][uVar21];
              uVar24 = 0;
              do {
                *(short *)((long)puVar14 + uVar24) =
                     (short)((uint)puVar17[lVar20 + uVar24] +
                             (uint)puVar17[uVar24 + 1] + (uint)puVar17[uVar24] +
                             (uint)puVar17[lVar20 + uVar24 + 1] + 2 >> 2);
                uVar26 = uVar24 + 2;
                lVar18 = uVar24 + 4;
                uVar24 = uVar26;
              } while (lVar18 <= lVar20);
              puVar14 = (unsigned_short *)((long)puVar14 + uVar26);
            }
            else if (factor == 3) {
              if (lVar20 < 3) goto LAB_00111fb4;
              puVar12 = pppuVar6[lVar13][uVar21] + 2;
              uVar24 = 3;
              do {
                uVar26 = uVar24;
                iVar15 = 0;
                iVar28 = 3;
                puVar23 = puVar12;
                do {
                  iVar15 = (uint)*puVar23 + (uint)puVar23[-1] + (uint)puVar23[-2] + iVar15;
                  puVar23 = puVar23 + lVar20;
                  iVar28 = iVar28 + -1;
                } while (iVar28 != 0);
                *puVar14 = (unsigned_short)((iVar15 + 4U) / 9);
                puVar14 = puVar14 + 1;
                puVar12 = puVar12 + 3;
                uVar24 = uVar26 + 3;
              } while ((long)(uVar26 + 3) <= lVar20);
            }
            else if (factor == 4) {
              if (lVar20 < 4) {
LAB_00111fb4:
                uVar26 = 0;
              }
              else {
                puVar11 = (ulong *)pppuVar6[lVar13][uVar21];
                uVar24 = 4;
                do {
                  uVar26 = uVar24;
                  iVar15 = 0;
                  iVar28 = 4;
                  puVar22 = puVar11;
                  do {
                    uVar24 = *puVar22;
                    auVar7._8_4_ = 0;
                    auVar7._0_8_ = uVar24;
                    auVar7._12_2_ = (short)(uVar24 >> 0x30);
                    auVar8._8_2_ = (short)(uVar24 >> 0x20);
                    auVar8._0_8_ = uVar24;
                    auVar8._10_4_ = auVar7._10_4_;
                    auVar9._6_8_ = 0;
                    auVar9._0_6_ = auVar8._8_6_;
                    iVar15 = iVar15 + (auVar7._10_4_ >> 0x10) +
                                      (int)CONCAT82(SUB148(auVar9 << 0x40,6),(short)(uVar24 >> 0x10)
                                                   ) + auVar8._8_4_ + (uint)(ushort)uVar24;
                    puVar22 = (ulong *)((long)puVar22 + lVar20 * 2);
                    iVar28 = iVar28 + -1;
                  } while (iVar28 != 0);
                  *puVar14 = (unsigned_short)(iVar15 + 8U >> 4);
                  puVar14 = puVar14 + 1;
                  puVar11 = puVar11 + 1;
                  uVar24 = uVar26 + 4;
                } while ((long)(uVar26 + 4) <= lVar20);
              }
            }
            else {
              if (lVar20 < (long)uVar25) goto LAB_00111fb4;
              puVar17 = pppuVar6[lVar13][uVar21];
              uVar24 = uVar25;
              do {
                uVar26 = uVar24;
                iVar28 = 0;
                iVar15 = 0;
                puVar10 = puVar17;
                do {
                  uVar24 = 0;
                  do {
                    iVar15 = iVar15 + (uint)puVar10[uVar24];
                    uVar24 = uVar24 + 1;
                  } while (uVar16 != uVar24);
                  iVar28 = iVar28 + 1;
                  puVar10 = puVar10 + lVar20;
                } while (iVar28 != factor);
                *puVar14 = (unsigned_short)((iVar15 + (factor * factor >> 1)) / (factor * factor));
                puVar14 = puVar14 + 1;
                puVar17 = puVar17 + uVar25;
                uVar24 = uVar25 + uVar26;
              } while ((long)(uVar25 + uVar26) <= lVar20);
            }
            if ((long)uVar26 < lVar2) {
              puVar17 = pppuVar6[lVar13][uVar21] + uVar26;
              iVar19 = 0;
              iVar28 = 0;
              iVar15 = 0;
              do {
                uVar24 = 0;
                do {
                  if (lVar2 - uVar26 == uVar24) break;
                  iVar15 = iVar15 + (uint)puVar17[uVar24];
                  uVar24 = uVar24 + 1;
                } while (uVar16 != uVar24);
                iVar28 = iVar28 + (int)uVar24;
                iVar19 = iVar19 + 1;
                puVar17 = puVar17 + lVar2;
              } while (iVar19 != factor);
              *puVar14 = (unsigned_short)(((iVar28 >> 1) + iVar15) / iVar28);
              puVar14 = puVar14 + 1;
            }
            uVar24 = uVar27 + uVar25;
            uVar21 = uVar27;
          } while ((long)(uVar27 + uVar25) <= lVar3);
        }
        if ((long)uVar27 < lVar3 && 0 < lVar2) {
          puVar17 = pppuVar5[lVar13][uVar27];
          lVar20 = 0;
          do {
            iVar28 = 0;
            iVar15 = 0;
            puVar10 = puVar17;
            uVar24 = 0;
            do {
              uVar21 = 0;
              do {
                if (lVar2 <= (long)(lVar20 + uVar21)) break;
                iVar15 = iVar15 + (uint)puVar10[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar16 != uVar21);
              iVar28 = iVar28 + (int)uVar21;
            } while ((uVar24 + 1 < uVar16) &&
                    (puVar10 = puVar10 + lVar2, lVar18 = uVar27 + uVar24, uVar24 = uVar24 + 1,
                    lVar18 + 1 < lVar3));
            *puVar14 = (unsigned_short)(((iVar28 >> 1) + iVar15) / iVar28);
            puVar14 = puVar14 + 1;
            lVar20 = lVar20 + uVar25;
            puVar17 = puVar17 + uVar25;
          } while (lVar20 < lVar2);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> downscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    T *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      if (factor == 2)
      {
        // speeding up special case of averaging over 2*2 pixels

        while (i+2 <= image.getWidth())
        {
          typename Image<T>::work_t v;

          const T *in=image.getPtr(i, k, d);

          v=*in+in[1];
          in+=image.getWidth();
          v+=*in+in[1];

          *out++=static_cast<typename Image<T>::store_t>((v+2)/4);
          i+=2;
        }
      }
      else if (factor == 3)
      {
        // speeding up special case of averaging over 3*3 pixels

        while (i+3 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<3; j++)
          {
            v+=*in+in[1]+in[2];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+4)/9);
          i+=3;
        }
      }
      else if (factor == 4)
      {
        // speeding up special case of averaging over 4*4 pixels

        while (i+4 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<4; j++)
          {
            v+=*in+in[1]+in[2]+in[3];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+8)/16);
          i+=4;
        }
      }
      else
      {
        // average over factor*factor pixels of the input image

        while (i+factor <= image.getWidth())
        {
          typename Image<T>::work_t v=0;
          int n=0;

          const T *in=image.getPtr(i, k, d);

          for (int kk=0; kk<factor; kk++)
          {
            for (int ii=0; ii<factor; ii++)
            {
              v+=in[ii];
              n++;
            }

            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
          i+=factor;
        }
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }
    }
  }

  return ret;
}